

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task20.cpp
# Opt level: O0

int main(void)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int *arr_00;
  ostream *poVar3;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  int *arr;
  int n;
  
  arr._4_4_ = 0;
  std::istream::operator>>((istream *)&std::cin,(int *)&arr);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)arr;
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  arr_00 = (int *)operator_new__(uVar2);
  for (local_1c = 0; local_1c < (int)arr; local_1c = local_1c + 1) {
    std::istream::operator>>((istream *)&std::cin,arr_00 + local_1c);
  }
  bubble_sort(arr_00,(int)arr);
  for (local_20 = 0; local_20 < (int)arr; local_20 = local_20 + 1) {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,arr_00[local_20]);
    std::operator<<(poVar3,' ');
  }
  if (arr_00 != (int *)0x0) {
    operator_delete__(arr_00);
  }
  return 0;
}

Assistant:

int main(){
    int n;
    cin >> n;
    int* arr = new int [n];
    for (int i = 0; i < n; i++) cin >> arr[i];
    bubble_sort(arr, n);
    for (int i = 0; i < n; i++) cout << arr[i] << ' ';
    delete[] arr;
    return 0;
}